

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O0

void __thiscall wasm::Vacuum::visitIf(Vacuum *this,If *curr)

{
  bool bVar1;
  Const *pCVar2;
  int64_t iVar3;
  PassOptions *pPVar4;
  element_type *peVar5;
  Drop *pDVar6;
  Module *pMVar7;
  optional<wasm::Type> type_;
  bool local_89;
  Builder local_80;
  Builder local_78 [2];
  optional<wasm::Type> local_68;
  Expression *local_58;
  Expression *right;
  Expression *left;
  undefined1 local_40 [8];
  anon_class_16_2_3fdeafed optimizeArm;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  Expression *child;
  Const *value;
  If *curr_local;
  Vacuum *this_local;
  
  value = (Const *)curr;
  curr_local = (If *)this;
  pCVar2 = Expression::dynCast<wasm::Const>(curr->condition);
  if (pCVar2 == (Const *)0x0) {
    optimizeArm.curr._4_4_ = 1;
    bVar1 = wasm::Type::operator==
                      ((Type *)&((value->value).field_0.gcData.
                                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                )->values,(BasicType *)((long)&optimizeArm.curr + 4));
    if (bVar1) {
      ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                  ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
                 (Expression *)
                 (value->value).field_0.gcData.
                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    else {
      pPVar4 = Pass::getPassOptions((Pass *)this);
      local_89 = false;
      if ((pPVar4->trapsNeverHappen & 1U) != 0) {
        optimizeArm.curr._0_4_ = 1;
        local_89 = wasm::Type::operator!=
                             (&(value->super_SpecificExpression<(wasm::Expression::Id)14>).
                               super_Expression.type,(BasicType *)&optimizeArm.curr);
      }
      if (local_89 != false) {
        optimizeArm.this = (Vacuum *)&value;
        local_40 = (undefined1  [8])this;
        bVar1 = visitIf::anon_class_16_2_3fdeafed::operator()
                          ((anon_class_16_2_3fdeafed *)local_40,
                           (Expression *)
                           (value->value).field_0.gcData.
                           super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,(Expression *)(value->value).type.id);
        if (bVar1) {
          return;
        }
        if (((value->value).type.id != 0) &&
           (bVar1 = visitIf::anon_class_16_2_3fdeafed::operator()
                              ((anon_class_16_2_3fdeafed *)local_40,
                               (Expression *)(value->value).type.id,
                               (Expression *)
                               (value->value).field_0.gcData.
                               super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi), bVar1)) {
          return;
        }
      }
      if ((value->value).type.id == 0) {
        bVar1 = Expression::is<wasm::Nop>
                          ((Expression *)
                           (value->value).field_0.gcData.
                           super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
        if (bVar1) {
          pMVar7 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                             ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                              &(this->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                             );
          Builder::Builder(&local_80,pMVar7);
          pDVar6 = Builder::makeDrop(&local_80,
                                     (Expression *)
                                     (value->value).field_0.gcData.
                                     super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
          ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                    (&(this->
                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                      ).
                      super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
                     (Expression *)pDVar6);
        }
      }
      else {
        bVar1 = Expression::is<wasm::Nop>((Expression *)(value->value).type.id);
        if (bVar1) {
          (value->value).type.id = 0;
        }
        else {
          bVar1 = Expression::is<wasm::Nop>
                            ((Expression *)
                             (value->value).field_0.gcData.
                             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
          if (bVar1) {
            (value->value).field_0.func.super_IString.str._M_str = (char *)(value->value).type.id;
            (value->value).type.id = 0;
            pMVar7 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                               ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                                &(this->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                               );
            Builder::Builder((Builder *)&left,pMVar7);
            peVar5 = (element_type *)
                     Builder::makeUnary((Builder *)&left,EqZInt32,
                                        (Expression *)
                                        (value->value).field_0.gcData.
                                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
            (value->value).field_0.gcData.
            super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
          }
          else {
            bVar1 = Expression::is<wasm::Drop>
                              ((Expression *)
                               (value->value).field_0.gcData.
                               super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
            if ((bVar1) &&
               (bVar1 = Expression::is<wasm::Drop>((Expression *)(value->value).type.id), bVar1)) {
              pDVar6 = Expression::cast<wasm::Drop>
                                 ((Expression *)
                                  (value->value).field_0.gcData.
                                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
              right = pDVar6->value;
              pDVar6 = Expression::cast<wasm::Drop>((Expression *)(value->value).type.id);
              local_58 = pDVar6->value;
              bVar1 = wasm::Type::operator==(&right->type,&local_58->type);
              pCVar2 = value;
              if (bVar1) {
                (value->value).field_0.gcData.
                super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)right;
                (value->value).type.id = (uintptr_t)local_58;
                std::optional<wasm::Type>::optional(&local_68);
                type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._9_7_ = 0;
                type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_payload =
                     local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Type>._M_payload;
                type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_engaged =
                     local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Type>._M_engaged;
                If::finalize((If *)pCVar2,type_);
                pMVar7 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                                   ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                                    &(this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                   );
                Builder::Builder(local_78,pMVar7);
                pDVar6 = Builder::makeDrop(local_78,(Expression *)value);
                ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::
                replaceCurrent(&(this->
                                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                ).
                                super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                               ,(Expression *)pDVar6);
              }
            }
          }
        }
      }
    }
  }
  else {
    iVar3 = wasm::Literal::getInteger(&pCVar2->value);
    if (iVar3 == 0) {
      if ((value->value).type.id == 0) {
        ExpressionManipulator::nop<wasm::If>((If *)value);
        return;
      }
      local_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(value->value).type.id;
    }
    else {
      local_28 = (value->value).field_0.gcData.
                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               (Expression *)local_28);
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    // if the condition is a constant, just apply it
    // we can just return the ifTrue or ifFalse.
    if (auto* value = curr->condition->dynCast<Const>()) {
      Expression* child;
      if (value->value.getInteger()) {
        child = curr->ifTrue;
      } else {
        if (curr->ifFalse) {
          child = curr->ifFalse;
        } else {
          ExpressionManipulator::nop(curr);
          return;
        }
      }
      replaceCurrent(child);
      return;
    }
    // if the condition is unreachable, just return it
    if (curr->condition->type == Type::unreachable) {
      replaceCurrent(curr->condition);
      return;
    }
    // from here on, we can assume the condition executed

    // In trapsNeverHappen mode, a definitely-trapping arm can be assumed to not
    // happen. Such conditional code can be assumed to never be reached in this
    // mode.
    //
    // Ignore the case of an unreachable if, such as having both arms be
    // unreachable. In that case we'd need to fix up the IR to avoid changing
    // the type; leave that for DCE to simplify first. After checking that
    // curr->type != unreachable, we can assume that only one of the arms is
    // unreachable (at most).
    if (getPassOptions().trapsNeverHappen && curr->type != Type::unreachable) {
      auto optimizeArm = [&](Expression* arm, Expression* otherArm) {
        if (!arm->is<Unreachable>()) {
          return false;
        }
        Builder builder(*getModule());
        Expression* rep = builder.makeDrop(curr->condition);
        if (otherArm) {
          rep = builder.makeSequence(rep, otherArm);
        }
        replaceCurrent(rep);
        return true;
      };

      // As mentioned above, do not try to optimize both arms; leave that case
      // for DCE.
      if (optimizeArm(curr->ifTrue, curr->ifFalse) ||
          (curr->ifFalse && optimizeArm(curr->ifFalse, curr->ifTrue))) {
        return;
      }
    }

    if (curr->ifFalse) {
      if (curr->ifFalse->is<Nop>()) {
        curr->ifFalse = nullptr;
      } else if (curr->ifTrue->is<Nop>()) {
        curr->ifTrue = curr->ifFalse;
        curr->ifFalse = nullptr;
        curr->condition =
          Builder(*getModule()).makeUnary(EqZInt32, curr->condition);
      } else if (curr->ifTrue->is<Drop>() && curr->ifFalse->is<Drop>()) {
        // instead of dropping both sides, drop the if, if they are the same
        // type
        auto* left = curr->ifTrue->cast<Drop>()->value;
        auto* right = curr->ifFalse->cast<Drop>()->value;
        if (left->type == right->type) {
          curr->ifTrue = left;
          curr->ifFalse = right;
          curr->finalize();
          replaceCurrent(Builder(*getModule()).makeDrop(curr));
        }
      }
    } else {
      // This is an if without an else. If the body is empty, we do not need it.
      if (curr->ifTrue->is<Nop>()) {
        replaceCurrent(Builder(*getModule()).makeDrop(curr->condition));
      }
    }
  }